

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BotSharedData.cpp
# Opt level: O3

void __thiscall tiger::trains::ai::BotSharedData::clear(BotSharedData *this,World *world)

{
  _Rb_tree_header *p_Var1;
  pointer ppTVar2;
  map<const_tiger::trains::world::Train_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>_>
  *this_00;
  int iVar3;
  int iVar4;
  vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *pvVar5;
  _Base_ptr p_Var6;
  vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_> *pvVar7;
  mapped_type *__k;
  Point *pPVar8;
  Player *this_01;
  IPost *pIVar9;
  undefined4 extraout_var;
  _Base_ptr p_Var10;
  pointer ppTVar11;
  pair<std::_Rb_tree_iterator<const_tiger::trains::world::Point_*>,_std::_Rb_tree_iterator<const_tiger::trains::world::Point_*>_>
  pVar12;
  pair<std::_Rb_tree_iterator<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>,_std::_Rb_tree_iterator<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>_>
  pVar13;
  Train *train;
  Train *local_48;
  map<const_tiger::trains::world::Train_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>_>
  *local_40;
  World *local_38;
  
  local_38 = world;
  pvVar5 = trains::world::World::getTrainList(world);
  ppTVar11 = (pvVar5->
             super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppTVar2 = (pvVar5->
            super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar11 != ppTVar2) {
    local_40 = &this->trainInPoints;
    p_Var1 = &(this->trainInPoints)._M_t._M_impl.super__Rb_tree_header;
    do {
      local_48 = *ppTVar11;
      p_Var6 = (this->trainInPoints)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var10 = &p_Var1->_M_header;
      if (p_Var6 != (_Base_ptr)0x0) {
        do {
          if (*(Train **)(p_Var6 + 1) >= local_48) {
            p_Var10 = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[*(Train **)(p_Var6 + 1) < local_48];
        } while (p_Var6 != (_Base_ptr)0x0);
        if ((((_Rb_tree_header *)p_Var10 != p_Var1) &&
            ((Train *)((_Rb_tree_header *)p_Var10)->_M_node_count <= local_48)) &&
           (pvVar7 = trains::world::Train::getEvents(local_48),
           (pvVar7->
           super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
           )._M_impl.super__Vector_impl_data._M_start !=
           (pvVar7->
           super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
           )._M_impl.super__Vector_impl_data._M_finish)) {
          pvVar7 = trains::world::Train::getEvents(local_48);
          iVar3 = (*(pvVar7->
                    super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_IEvent[3])();
          iVar4 = trains::world::World::getTickNum(local_38);
          this_00 = local_40;
          if (iVar4 + -3 <= iVar3) {
            __k = std::
                  map<const_tiger::trains::world::Train_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>_>
                  ::operator[](local_40,&local_48);
            pVar12 = std::
                     _Rb_tree<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::_Identity<const_tiger::trains::world::Point_*>,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<const_tiger::trains::world::Point_*>_>
                     ::equal_range((_Rb_tree<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::_Identity<const_tiger::trains::world::Point_*>,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<const_tiger::trains::world::Point_*>_>
                                    *)this,__k);
            std::
            _Rb_tree<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::_Identity<const_tiger::trains::world::Point_*>,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<const_tiger::trains::world::Point_*>_>
            ::_M_erase_aux((_Rb_tree<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::_Identity<const_tiger::trains::world::Point_*>,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<const_tiger::trains::world::Point_*>_>
                            *)this,(_Base_ptr)pVar12.first._M_node,(_Base_ptr)pVar12.second._M_node)
            ;
            pVar13 = std::
                     _Rb_tree<const_tiger::trains::world::Train_*,_std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>,_std::_Select1st<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>_>
                     ::equal_range(&this_00->_M_t,&local_48);
            std::
            _Rb_tree<const_tiger::trains::world::Train_*,_std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>,_std::_Select1st<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>_>
            ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar13.first._M_node,
                           (_Base_ptr)pVar13.second._M_node);
          }
        }
      }
      pPVar8 = trains::world::Train::getPoint(local_48);
      this_01 = trains::world::Train::getPlayer(local_48);
      pIVar9 = trains::world::Player::getHome(this_01);
      iVar3 = (*pIVar9->_vptr_IPost[5])(pIVar9);
      if (pPVar8 == (Point *)CONCAT44(extraout_var,iVar3)) {
        HomeChecker::comeHome(&this->cheker,local_48);
      }
      ppTVar11 = ppTVar11 + 1;
    } while (ppTVar11 != ppTVar2);
  }
  HomeChecker::blockHome(&this->cheker,&this->inPoints);
  return;
}

Assistant:

void BotSharedData::clear(world::World *world)
{
    for (auto train : world->getTrainList())
    {
        if (trainInPoints.count(train) != 0 && !train->getEvents().empty() &&
                train->getEvents().back()->getTick() >= world->getTickNum() - 3)
        {

            inPoints.erase(trainInPoints[train]);
            trainInPoints.erase(train);
        }

        if (train->getPoint() == train->getPlayer()->getHome()->getPoint())
            cheker.comeHome(train);

    }

    cheker.blockHome(inPoints);
}